

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_vector_of_tags.hpp
# Opt level: O1

void __thiscall
cfgfile::
tag_vector_of_tags_t<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_cfgfile::string_trait_t>
::on_start(tag_vector_of_tags_t<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_cfgfile::string_trait_t>
           *this,parser_info_t<cfgfile::string_trait_t> *info)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  *ptVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool local_2a;
  undefined1 local_29;
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  local_2a = (this->super_tag_t<cfgfile::string_trait_t>).m_is_mandatory;
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cfgfile::tag_scalar_t<std::__cxx11::string,cfgfile::string_trait_t>,std::allocator<cfgfile::tag_scalar_t<std::__cxx11::string,cfgfile::string_trait_t>>,std::__cxx11::string_const&,bool>
            (&_Stack_20,&local_28,
             (allocator<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>_>
              *)&local_29,&(this->super_tag_t<cfgfile::string_trait_t>).m_name,&local_2a);
  _Var3._M_pi = _Stack_20._M_pi;
  ptVar2 = local_28;
  local_28 = (tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
              *)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->m_current).
            super___shared_ptr<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->m_current).
  super___shared_ptr<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = ptVar2;
  (this->m_current).
  super___shared_ptr<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var3._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  peVar1 = (this->m_current).
           super___shared_ptr<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (peVar1->super_tag_t<cfgfile::string_trait_t>).m_parent =
       (this->super_tag_t<cfgfile::string_trait_t>).m_parent;
  (*(peVar1->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[4])(peVar1,info);
  return;
}

Assistant:

void on_start( const parser_info_t< Trait > & info ) override
	{
		m_current = std::make_shared< T > ( this->name(), this->is_mandatory() );
		m_current->set_parent( this->parent() );
		m_current->on_start( info );
	}